

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFilesGenerator::AddFilesInstallRule
          (cmInstallFilesGenerator *this,ostream *os,Indent *indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&(this->super_cmInstallGenerator).Destination,
             this->Programs | cmInstallType_FILES,files,this->Optional,
             (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(this->Rename)._M_dataplus._M_p,
             (char *)0x0,indent);
  return;
}

Assistant:

void cmInstallFilesGenerator::AddFilesInstallRule(
  std::ostream& os, Indent const& indent,
  std::vector<std::string> const& files)
{
  // Write code to install the files.
  const char* no_dir_permissions = 0;
  this->AddInstallRule(os,
                       this->Destination,
                       (this->Programs
                        ? cmInstallType_PROGRAMS
                        : cmInstallType_FILES),
                       files,
                       this->Optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       this->Rename.c_str(), 0, indent);
}